

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_post.c
# Opt level: O1

int unpost_form(FORM *form)

{
  ushort uVar1;
  int *piVar2;
  int iVar3;
  WINDOW_conflict *pWVar4;
  
  if (form == (FORM *)0x0) {
    iVar3 = -2;
  }
  else {
    uVar1 = form->status;
    iVar3 = -7;
    if (((uVar1 & 1) != 0) && (iVar3 = -5, (uVar1 & 2) == 0)) {
      if (form->fieldterm != (_func_void_formnode_ptr *)0x0) {
        form->status = uVar1 | 2;
        (*form->fieldterm)(form);
        *(byte *)&form->status = (byte)form->status & 0xfd;
      }
      if (form->formterm != (_func_void_formnode_ptr *)0x0) {
        *(byte *)&form->status = (byte)form->status | 2;
        (*form->formterm)(form);
        *(byte *)&form->status = (byte)form->status & 0xfd;
      }
      pWVar4 = form->sub;
      if ((form->sub == (WINDOW_conflict *)0x0) &&
         (pWVar4 = form->win, form->win == (WINDOW_conflict *)0x0)) {
        pWVar4 = _stdscr;
      }
      werase(pWVar4);
      delwin(form->w);
      form->w = (WINDOW_conflict *)0x0;
      *(byte *)&form->status = (byte)form->status & 0xfe;
      iVar3 = 0;
    }
  }
  piVar2 = __errno_location();
  *piVar2 = iVar3;
  return iVar3;
}

Assistant:

int unpost_form(FORM * form)
{
  if (!form)
    RETURN(E_BAD_ARGUMENT);

  if (!(form->status & _POSTED)) 
    RETURN(E_NOT_POSTED);

  if (form->status & _IN_DRIVER) 
    RETURN(E_BAD_STATE);

  Call_Hook(form,fieldterm);
  Call_Hook(form,formterm);

  werase(Get_Form_Window(form));
  delwin(form->w);
  form->w = (WINDOW *)0;
  form->status &= ~_POSTED;
  RETURN(E_OK);
}